

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_register_stream(cubeb_conflict1 *ctx,cubeb_stream_conflict1 *stm)

{
  undefined8 in_RSI;
  long in_RDI;
  int i;
  undefined4 local_14;
  
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x18));
  local_14 = 0;
  do {
    if (0xf < local_14) {
LAB_00114c12:
      pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x18));
      return (int)(local_14 == 0x10);
    }
    if (*(long *)(in_RDI + 0x40 + (long)local_14 * 8) == 0) {
      *(undefined8 *)(in_RDI + 0x40 + (long)local_14 * 8) = in_RSI;
      goto LAB_00114c12;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

static int
alsa_register_stream(cubeb * ctx, cubeb_stream * stm)
{
  int i;

  pthread_mutex_lock(&ctx->mutex);
  for (i = 0; i < CUBEB_STREAM_MAX; ++i) {
    if (!ctx->streams[i]) {
      ctx->streams[i] = stm;
      break;
    }
  }
  pthread_mutex_unlock(&ctx->mutex);

  return i == CUBEB_STREAM_MAX;
}